

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

void Gia_ManCleanLevels(Gia_Man_t *p,int Size)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  int iVar3;
  
  if (p->vLevels == (Vec_Int_t *)0x0) {
    pVVar1 = (Vec_Int_t *)malloc(0x10);
    iVar3 = 0x10;
    if (0xe < Size - 1U) {
      iVar3 = Size;
    }
    pVVar1->nSize = 0;
    pVVar1->nCap = iVar3;
    if (iVar3 == 0) {
      piVar2 = (int *)0x0;
    }
    else {
      piVar2 = (int *)malloc((long)iVar3 << 2);
    }
    pVVar1->pArray = piVar2;
    p->vLevels = pVVar1;
  }
  pVVar1 = p->vLevels;
  if (pVVar1->nCap < Size) {
    if (pVVar1->pArray == (int *)0x0) {
      piVar2 = (int *)malloc((long)Size << 2);
    }
    else {
      piVar2 = (int *)realloc(pVVar1->pArray,(long)Size << 2);
    }
    pVVar1->pArray = piVar2;
    if (piVar2 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar1->nCap = Size;
  }
  if (0 < Size) {
    memset(pVVar1->pArray,0,(ulong)(uint)Size << 2);
  }
  pVVar1->nSize = Size;
  return;
}

Assistant:

void Gia_ManCleanLevels( Gia_Man_t * p, int Size )
{
    if ( p->vLevels == NULL )
        p->vLevels = Vec_IntAlloc( Size );
    Vec_IntFill( p->vLevels, Size, 0 );
}